

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSM::output(FSM *this,string *var_name,shared_ptr<kratos::Var> *default_)

{
  undefined1 local_30 [8];
  shared_ptr<kratos::Var> var;
  shared_ptr<kratos::Var> *default__local;
  string *var_name_local;
  FSM *this_local;
  
  var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)default_;
  Generator::get_var((Generator *)local_30,(string *)this->generator_);
  output(this,(shared_ptr<kratos::Var> *)local_30,
         (shared_ptr<kratos::Var> *)
         var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_30);
  return;
}

Assistant:

void FSM::output(const std::string& var_name, const std::shared_ptr<Var>& default_) {
    auto var = generator_->get_var(var_name);
    output(var, default_);
}